

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O3

bool __thiscall
PixelToaster::UnixDisplay::update
          (UnixDisplay *this,TrueColorPixel *trueColorPixels,FloatingPointPixel *floatingPointPixels
          ,Rectangle *dirtyBox)

{
  long *plVar1;
  XImage *pXVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  if (this->isShuttingDown_ == true) {
    (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[3])(this);
    return false;
  }
  if (this->display_ == (Display *)0x0) {
    return false;
  }
  if (this->window_ == 0) {
    return false;
  }
  if (this->image_ == (XImage *)0x0) {
    return false;
  }
  iVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[9])(this);
  iVar4 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[10])(this);
  if (trueColorPixels == (TrueColorPixel *)0x0) {
    lVar5 = 0x160;
    trueColorPixels = (TrueColorPixel *)floatingPointPixels;
    if (floatingPointPixels == (FloatingPointPixel *)0x0) {
      return false;
    }
  }
  else {
    lVar5 = 0x158;
    if ((this->destFormat_).enumeration == XRGB8888) goto LAB_00108763;
  }
  plVar1 = *(long **)((this->super_DisplayAdapter)._title + lVar5 + -8);
  (**(code **)(*plVar1 + 0x18))(plVar1,trueColorPixels,(this->buffer_).data_,iVar4 * iVar3);
  trueColorPixels = (TrueColorPixel *)(this->buffer_).data_;
LAB_00108763:
  pXVar2 = this->image_;
  pXVar2->data = (char *)trueColorPixels;
  XPutImage(this->display_,this->window_,this->gc_,pXVar2,0,0,0,0,iVar3,iVar4);
  XFlush(this->display_);
  this->image_->data = (char *)0x0;
  pumpEvents(this);
  return true;
}

Assistant:

bool update(const TrueColorPixel* trueColorPixels, const FloatingPointPixel* floatingPointPixels, const Rectangle* dirtyBox) override
    {
        if (isShuttingDown_)
        {
            close();
            return false;
        }

        if (!display_ || !window_ || !image_)
            return false;

        const int w    = width();
        const int h    = height();
        const int size = w * h;

        const bool shortcut = trueColorPixels != nullptr && destFormat_ == Format::XRGB8888;

        if (!shortcut)
        {
            // extra conversion step: copy pixels to buffer

            if (trueColorPixels)
                trueColorConverter_->convert(trueColorPixels, buffer_.get(), size);
            else if (floatingPointPixels)
                floatingPointConverter_->convert(floatingPointPixels, buffer_.get(), size);
            else
                return false;

            image_->data = buffer_.get();
        }
        else
        {
            // shortcut: avoid extra copy - only works for truecolor pixels

            image_->data = (char*)trueColorPixels;
        }

        ::XPutImage(display_, window_, gc_, image_, 0, 0, 0, 0, w, h);
        ::XFlush(display_);

        image_->data = nullptr;

        pumpEvents();

        return true;
    }